

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

Block * duckdb_moodycamel::
        ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
        ::
        create_array<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  (size_t count)

{
  Block *pBVar1;
  bool *pbVar2;
  bool bVar3;
  
  pBVar1 = (Block *)malloc(count * 0x348);
  if (pBVar1 != (Block *)0x0) {
    pbVar2 = &pBVar1->dynamicallyAllocated;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      (((atomic<unsigned_int> *)(pbVar2 + -0x11))->super___atomic_base<unsigned_int>)._M_i = 0;
      (((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
         *)(pbVar2 + -9))->_M_b)._M_p = (__pointer_type)0x0;
      *(undefined2 *)(pbVar2 + -1) = 0x100;
      *(Block **)(pbVar2 + -0x41) = (Block *)0x0;
      (((atomic<unsigned_long> *)(pbVar2 + -0x39))->super___atomic_base<unsigned_long>)._M_i = 0;
      pbVar2 = pbVar2 + 0x348;
    }
  }
  return pBVar1;
}

Assistant:

static inline U* create_array(size_t count)
	{
		assert(count > 0);
		U* p = static_cast<U*>(aligned_malloc<U>(sizeof(U) * count));
		if (p == nullptr)
			return nullptr;

		for (size_t i = 0; i != count; ++i)
			new (p + i) U();
		return p;
	}